

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::Pipeline::SerializeWithCachedSizes(Pipeline *this,CodedOutputStream *output)

{
  uint uVar1;
  int iVar2;
  int size;
  Model *value;
  char *data;
  string *value_00;
  int local_28;
  int n_1;
  int i_1;
  uint n;
  uint i;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  Pipeline *this_local;
  
  i_1 = 0;
  uVar1 = models_size(this);
  for (; (uint)i_1 < uVar1; i_1 = i_1 + 1) {
    value = models(this,i_1);
    google::protobuf::internal::WireFormatLite::WriteMessage(1,&value->super_MessageLite,output);
  }
  local_28 = 0;
  iVar2 = names_size(this);
  for (; local_28 < iVar2; local_28 = local_28 + 1) {
    names_abi_cxx11_(this,local_28);
    data = (char *)std::__cxx11::string::data();
    names_abi_cxx11_(this,local_28);
    size = std::__cxx11::string::length();
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (data,size,SERIALIZE,"CoreML.Specification.Pipeline.names");
    value_00 = names_abi_cxx11_(this,local_28);
    google::protobuf::internal::WireFormatLite::WriteString(2,value_00,output);
  }
  return;
}

Assistant:

void Pipeline::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.Pipeline)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated .CoreML.Specification.Model models = 1;
  for (unsigned int i = 0, n = this->models_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      1, this->models(i), output);
  }

  // repeated string names = 2;
  for (int i = 0, n = this->names_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->names(i).data(), this->names(i).length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.Pipeline.names");
    ::google::protobuf::internal::WireFormatLite::WriteString(
      2, this->names(i), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.Pipeline)
}